

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O1

int Wlc_StdinProcessSmt(Abc_Frame_t *pAbc,char *pCmd)

{
  int iVar1;
  int iVar2;
  Vec_Str_t *pVVar3;
  Wlc_Ntk_t *pWVar4;
  char *pcVar5;
  void *pvVar6;
  Abc_Cex_t *pCex;
  int level;
  Abc_Frame_t *pAVar7;
  char *pcVar8;
  
  pVVar3 = Wlc_StdinCollectProblem("(check-sat)");
  pcVar8 = pVVar3->pArray;
  pWVar4 = Wlc_ReadSmtBuffer("top",pcVar8,pcVar8 + pVVar3->nSize,0,0);
  if (pcVar8 != (char *)0x0) {
    free(pcVar8);
    pVVar3->pArray = (char *)0x0;
  }
  if (pVVar3 != (Vec_Str_t *)0x0) {
    free(pVVar3);
  }
  Wlc_SetNtk(pAbc,pWVar4);
  pAVar7 = pAbc;
  iVar1 = Cmd_CommandExecute(pAbc,pCmd);
  if (iVar1 == 0) {
    iVar1 = Abc_FrameReadProbStatus(pAbc);
    if (iVar1 == -1) {
      pcVar8 = "undecided";
    }
    else {
      iVar1 = Abc_FrameReadProbStatus(pAbc);
      if (iVar1 == 1) {
        pcVar8 = "unsat";
      }
      else {
        iVar1 = Abc_FrameReadProbStatus(pAbc);
        if (iVar1 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                        ,0xd4,"int Wlc_StdinProcessSmt(Abc_Frame_t *, char *)");
        }
        pcVar8 = "sat";
      }
    }
    puts(pcVar8);
    fflush(_stdout);
    pVVar3 = Wlc_StdinCollectQuery();
    iVar1 = 1;
    while (pVVar3 != (Vec_Str_t *)0x0) {
      pcVar8 = pVVar3->pArray;
      pcVar5 = strtok(pcVar8," \n\t\r()");
      iVar2 = strcmp(pcVar5,"get-value");
      level = (int)pcVar5;
      if (iVar2 != 0) {
        pcVar5 = "ABC is expecting \"get-value\" in a follow-up input of the satisfiable problem.\n"
        ;
LAB_001cac44:
        Abc_Print(level,pcVar5);
        if (pcVar8 != (char *)0x0) {
          free(pcVar8);
          pVVar3->pArray = (char *)0x0;
        }
        free(pVVar3);
        return 0;
      }
      pAVar7 = pAbc;
      iVar2 = Abc_FrameReadProbStatus(pAbc);
      level = (int)pAVar7;
      if (iVar2 != 0) {
        pcVar5 = 
        "ABC received a follow-up input for a problem that is not known to be satisfiable.\n";
        goto LAB_001cac44;
      }
      pcVar5 = strtok((char *)0x0,"() \n\t\r");
      pAVar7 = pAbc;
      pvVar6 = Abc_FrameReadCex(pAbc);
      level = (int)pAVar7;
      if (pvVar6 == (void *)0x0) {
        pcVar5 = 
        "ABC does not have a counter-example available to process a \"get-value\" request.\n";
        goto LAB_001cac44;
      }
      pWVar4 = (Wlc_Ntk_t *)pAbc->pAbcWlc;
      pCex = (Abc_Cex_t *)Abc_FrameReadCex(pAbc);
      Wlc_NtkReport(pWVar4,pCex,pcVar5,0x10);
      if (pcVar8 != (char *)0x0) {
        free(pcVar8);
        pVVar3->pArray = (char *)0x0;
      }
      free(pVVar3);
      fflush(_stdout);
      pVVar3 = Wlc_StdinCollectQuery();
    }
  }
  else {
    iVar1 = 0;
    Abc_Print((int)pAVar7,"Something did not work out with the command \"%s\".\n",pCmd);
  }
  return iVar1;
}

Assistant:

int Wlc_StdinProcessSmt( Abc_Frame_t * pAbc, char * pCmd )
{
    // collect stdin until (check-sat)
    Vec_Str_t * vInput = Wlc_StdinCollectProblem( "(check-sat)" );
    // parse input
    Wlc_Ntk_t * pNtk = Wlc_ReadSmtBuffer( "top", Vec_StrArray(vInput), Vec_StrArray(vInput) + Vec_StrSize(vInput), 0, 0 );
    Vec_StrFree( vInput );
    // install current network
    Wlc_SetNtk( pAbc, pNtk );
    // execute command
    if ( Cmd_CommandExecute(pAbc, pCmd) )
    {
        Abc_Print( 1, "Something did not work out with the command \"%s\".\n", pCmd );
        return 0;
    }
    // solver finished
    if ( Abc_FrameReadProbStatus(pAbc) == -1 )
        printf( "undecided\n" );
    else if ( Abc_FrameReadProbStatus(pAbc) == 1 )
        printf( "unsat\n" );
    else if ( Abc_FrameReadProbStatus(pAbc) == 0 )
        printf( "sat\n" );
    else assert( 0 );
    fflush( stdout );
    // wait for stdin for give directions
    while ( (vInput = Wlc_StdinCollectQuery()) != NULL )
    {
        char * pName = strtok( Vec_StrArray(vInput), " \n\t\r()" );
        // check directive 
        if ( strcmp(pName, "get-value") )
        {
            Abc_Print( 1, "ABC is expecting \"get-value\" in a follow-up input of the satisfiable problem.\n" );
            Vec_StrFree( vInput );
            return 0;
        }
        // check status
        if ( Abc_FrameReadProbStatus(pAbc) != 0 )
        {
            Abc_Print( 1, "ABC received a follow-up input for a problem that is not known to be satisfiable.\n" );
            Vec_StrFree( vInput );
            return 0;
        }
        // get the variable number
        pName = strtok( NULL, "() \n\t\r" );
        // get the counter-example
        if ( Abc_FrameReadCex(pAbc) == NULL )
        {
            Abc_Print( 1, "ABC does not have a counter-example available to process a \"get-value\" request.\n" );
            Vec_StrFree( vInput );
            return 0;
        }
        // report value of this variable
        Wlc_NtkReport( (Wlc_Ntk_t *)pAbc->pAbcWlc, (Abc_Cex_t *)Abc_FrameReadCex(pAbc), pName, 16 );
        Vec_StrFree( vInput );
        fflush( stdout );
    }
    return 1;
}